

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddTriangle(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImU32 col,float thickness)

{
  ImDrawList *in_RCX;
  ImDrawList *in_RDI;
  uint in_R8D;
  undefined4 in_XMM0_Da;
  ImVec2 *in_stack_ffffffffffffffc8;
  undefined1 closed;
  
  closed = (undefined1)((uint)in_XMM0_Da >> 0x18);
  if ((in_R8D & 0xff000000) != 0) {
    PathLineTo(in_RDI,in_stack_ffffffffffffffc8);
    PathLineTo(in_RDI,in_stack_ffffffffffffffc8);
    PathLineTo(in_RDI,in_stack_ffffffffffffffc8);
    PathStroke(in_RCX,in_R8D,(bool)closed,(float)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void ImDrawList::AddTriangle(const ImVec2& a, const ImVec2& b, const ImVec2& c, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathStroke(col, true, thickness);
}